

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_std_impl.c
# Opt level: O0

memory_allocator_impl memory_allocator_std_create(void *ctx)

{
  undefined8 *in_RDI;
  memory_allocator_std_impl std_impl;
  memory_allocator_std_ctx std_ctx;
  undefined8 *local_8;
  
  local_8 = (undefined8 *)(*(code *)*in_RDI)(0x18);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    *local_8 = *in_RDI;
    local_8[1] = in_RDI[1];
    local_8[2] = in_RDI[2];
  }
  return local_8;
}

Assistant:

memory_allocator_impl memory_allocator_std_create(void *ctx)
{
	memory_allocator_std_ctx std_ctx = (memory_allocator_std_ctx)ctx;

	memory_allocator_std_impl std_impl = std_ctx->malloc(sizeof(struct memory_allocator_std_impl_type));

	if (std_impl == NULL)
	{
		return NULL;
	}

	std_impl->malloc = std_ctx->malloc;
	std_impl->realloc = std_ctx->realloc;
	std_impl->free = std_ctx->free;

	return (memory_allocator_impl)std_impl;
}